

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

void __thiscall kj::anon_unknown_123::AsyncPipe::abortRead(AsyncPipe *this)

{
  AsyncCapabilityStream *pAVar1;
  PromiseFulfiller<void> *pPVar2;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> local_38;
  Own<kj::(anonymous_namespace)::AsyncPipe::AbortedRead,_std::nullptr_t> local_20;
  
  pAVar1 = (this->state).ptr;
  if (pAVar1 != (AsyncCapabilityStream *)0x0) {
    (*(pAVar1->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream[7])();
    return;
  }
  local_38.ptr = (AsyncCapabilityStream *)operator_new(0x10);
  ((local_38.ptr)->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
       (_func_int **)&PTR_read_00599328;
  ((local_38.ptr)->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream =
       (_func_int **)&PTR_write_005993e8;
  local_20.disposer =
       (Disposer *)&kj::_::HeapDisposer<kj::(anonymous_namespace)::AsyncPipe::AbortedRead>::instance
  ;
  local_38.disposer =
       (Disposer *)&kj::_::HeapDisposer<kj::(anonymous_namespace)::AsyncPipe::AbortedRead>::instance
  ;
  local_20.ptr = (AbortedRead *)0x0;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t>::operator=(&this->ownState,&local_38);
  Own<kj::AsyncCapabilityStream,_std::nullptr_t>::dispose(&local_38);
  Own<kj::(anonymous_namespace)::AsyncPipe::AbortedRead,_std::nullptr_t>::~Own(&local_20);
  pPVar2 = (this->readAbortFulfiller).ptr.ptr;
  (this->state).ptr = (this->ownState).ptr;
  this->readAborted = true;
  if (pPVar2 != (PromiseFulfiller<void> *)0x0) {
    (*(pPVar2->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar2,&local_38);
    local_38.disposer = (Disposer *)0x0;
    local_38.ptr = (AsyncCapabilityStream *)0x0;
    Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator=
              (&(this->readAbortFulfiller).ptr,
               (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&local_38);
    Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose
              ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&local_38);
  }
  return;
}

Assistant:

void abortRead() override {
    KJ_IF_SOME(s, state) {
      s.abortRead();
    } else {
      ownState = kj::heap<AbortedRead>();
      state = *ownState;

      readAborted = true;
      KJ_IF_SOME(f, readAbortFulfiller) {
        f->fulfill();
        readAbortFulfiller = kj::none;
      }
    }